

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

InterfaceHandle __thiscall
helics::CommonCore::registerCloningFilter
          (CommonCore *this,string_view filterName,string_view type_in,string_view type_out)

{
  GlobalFederateId global_federateId;
  BaseType BVar1;
  byte *__src;
  pair<helics::route_id,_helics::ActionMessage> *ppVar2;
  ActionMessage reg;
  ActionMessage local_e8;
  
  checkNewInterface(this,(LocalFederateId)0xfffffefd,filterName,FILTER);
  global_federateId.gid = (this->filterFedID)._M_i.gid;
  ppVar2 = createBasicHandle(this,global_federateId,(LocalFederateId)0x88ca6c00,FILTER,filterName,
                             type_in,type_out,0x200);
  BVar1 = *(BaseType *)&ppVar2->field_0x4;
  ActionMessage::ActionMessage(&local_e8,cmd_reg_filter);
  __src = *(byte **)&(ppVar2->second).source_id;
  local_e8.payload.bufferSize._0_4_ = (ppVar2->second).dest_id;
  local_e8.payload.bufferSize._4_4_ = (ppVar2->second).dest_handle;
  local_e8.source_id.gid = global_federateId.gid;
  local_e8.source_handle.hid = BVar1;
  if ((local_e8.payload.heap != __src) &&
     (SmallBuffer::reserve(&local_e8.payload,local_e8.payload.bufferSize),
     local_e8.payload.bufferSize != 0)) {
    memcpy(local_e8.payload.heap,__src,local_e8.payload.bufferSize);
  }
  local_e8.flags._1_1_ = local_e8.flags._1_1_ | 2;
  if (type_out._M_len != 0 || type_in._M_len != 0) {
    ActionMessage::setStringData(&local_e8,type_in,type_out);
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&local_e8);
  ActionMessage::~ActionMessage(&local_e8);
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::registerCloningFilter(std::string_view filterName,
                                                  std::string_view type_in,
                                                  std::string_view type_out)
{
    checkNewInterface(gLocalCoreId, filterName, InterfaceType::FILTER);
    auto fid = filterFedID.load();

    const auto& handle = createBasicHandle(fid,
                                           LocalFederateId(),
                                           InterfaceType::FILTER,
                                           filterName,
                                           type_in,
                                           type_out,
                                           make_flags(clone_flag));

    auto hid = handle.getInterfaceHandle();

    ActionMessage reg(CMD_REG_FILTER);
    reg.source_id = fid;
    reg.source_handle = hid;
    reg.name(handle.key);
    setActionFlag(reg, clone_flag);
    if ((!type_in.empty()) || (!type_out.empty())) {
        reg.setStringData(type_in, type_out);
    }
    actionQueue.push(std::move(reg));
    return hid;
}